

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeerGateways.hpp
# Opt level: O3

void __thiscall
ableton::discovery::
PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::PeerGateways(PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
               *this,seconds rescanPeriod,
              pair<ableton::link::NodeState,_ableton::link::GhostXForm> *state,
              GatewayFactory factory,
              Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              *io)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  native_handle_type nVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  long lVar6;
  InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  *pIVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  undefined1 local_59;
  InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  duration<long,_std::ratio<1L,_1L>_> local_40;
  Injected<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>_>
  local_38;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_28;
  
  (this->mpScanner).
  super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->mpScanner).
  super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mpScannerCallback).
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->mpScannerCallback).
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mIo).val.mpService._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false> =
       (io_context *)
       (io->val).mpService._M_t.
       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
       super__Head_base<0UL,_asio::io_context_*,_false>;
  (io->val).mpService._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false> = (_Head_base<0UL,_asio::io_context_*,_false>)0x0
  ;
  (this->mIo).val.mThread._M_id._M_thread = 0;
  nVar3 = (io->val).mThread._M_id._M_thread;
  (this->mIo).val.mpWork._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
       (io->val).mpWork._M_t.
       super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>.
       _M_t.
       super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
       .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl;
  (this->mIo).val.mThread._M_id._M_thread = nVar3;
  (io->val).mpWork._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = (work *)0x0;
  (io->val).mThread._M_id._M_thread = 0;
  local_40.__r = rescanPeriod.__r;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
  (local_38.shared.
   super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_38.shared.
   super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_38.shared.
   super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00178a40;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_38.shared.
             super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  pp_Var1 = (_func_int **)(state->first).timeline.timeOrigin.__r;
  pp_Var4 = (_func_int **)(state->second).intercept.__r;
  *(double *)
   &local_38.shared.
    super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[3]._M_use_count = (state->second).slope;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[4]._vptr__Sp_counted_base = pp_Var4;
  uVar5 = *(undefined8 *)(state->first).sessionId.super_NodeIdArray._M_elems;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       *(_func_int ***)(state->first).nodeId.super_NodeIdArray._M_elems;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_use_count = (int)uVar5;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_weak_count = (int)((ulong)uVar5 >> 0x20);
  lVar6 = (state->first).timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
          super__Head_base<0UL,_long,_false>._M_head_impl;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._vptr__Sp_counted_base =
       (_func_int **)
       (state->first).timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._M_use_count = (int)lVar6;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._M_weak_count = (int)((ulong)lVar6 >> 0x20);
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[3]._vptr__Sp_counted_base = pp_Var1;
  *(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
    **)&local_38.shared.
        super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi[4]._M_use_count = factory.mController;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)&this->mIo;
  *(undefined4 *)
   &local_38.shared.
    super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[6]._vptr__Sp_counted_base = 0;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[6]._M_use_count = 0;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[6]._M_weak_count = 0;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[7]._vptr__Sp_counted_base =
       (_func_int **)
       (local_38.shared.
        super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi + 6);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_38.shared.
    super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[7]._M_use_count =
       local_38.shared.
       super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi + 6;
  local_38.shared.
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->mpScannerCallback).
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_38.shared.
            super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (this->mpScannerCallback).
           super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->mpScannerCallback).
  super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_38.shared.
       super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    local_38.shared.
    super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (this->mpScannerCallback).
         super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_38.shared.
    super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (this->mpScannerCallback).
              super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (local_38.shared.
        super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38.shared.
      super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_00161c4e;
    }
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_38.shared.
     super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count =
         (local_38.shared.
          super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_38.shared.
     super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count =
         (local_38.shared.
          super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
  }
LAB_00161c4e:
  local_58 = (element_type *)0x0;
  local_28.ref._M_data =
       (reference_wrapper<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
        )(reference_wrapper<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
          )&this->mIo;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::Callback>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>,std::allocator<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::Callback>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>>,std::chrono::duration<long,std::ratio<1l,1l>>const&,ableton::util::Injected<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::Callback>>,ableton::util::Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>>
            (a_Stack_50,&local_58,
             (allocator<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>_>
              *)&local_59,&local_40,&local_38,&local_28);
  _Var8._M_pi = a_Stack_50[0]._M_pi;
  pIVar7 = local_58;
  local_58 = (InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
              *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->mpScanner).
           super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->mpScanner).
  super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pIVar7;
  (this->mpScanner).
  super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var8._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
  }
  if (local_38.shared.
      super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.shared.
               super___shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

PeerGateways(const std::chrono::seconds rescanPeriod,
    NodeState state,
    GatewayFactory factory,
    util::Injected<IoContext> io)
    : mIo(std::move(io))
  {
    mpScannerCallback =
      std::make_shared<Callback>(std::move(state), std::move(factory), *mIo);
    mpScanner = std::make_shared<Scanner>(
      rescanPeriod, util::injectShared(mpScannerCallback), util::injectRef(*mIo));
  }